

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

bool __thiscall
front::syntax::SyntaxAnalyze::try_word(SyntaxAnalyze *this,int n,Token tk1,Token tk2,Token tk3)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  int in_ESI;
  long in_RDI;
  bool return_value;
  undefined1 local_31;
  undefined7 in_stack_ffffffffffffffe0;
  byte bVar4;
  
  bVar4 = 0;
  uVar3 = *(long *)(in_RDI + 8) + (long)in_ESI;
  sVar2 = std::vector<front::word::Word,_std::allocator<front::word::Word>_>::size
                    (*(vector<front::word::Word,_std::allocator<front::word::Word>_> **)
                      (in_RDI + 0x18));
  local_31 = bVar4;
  if (uVar3 < sVar2) {
    bVar1 = try_word((SyntaxAnalyze *)CONCAT17(bVar4,in_stack_ffffffffffffffe0),(int)(uVar3 >> 0x20)
                     ,(Token)uVar3);
    local_31 = 1;
    if (!bVar1) {
      bVar1 = try_word((SyntaxAnalyze *)CONCAT17(bVar4,in_stack_ffffffffffffffe0),
                       (int)(uVar3 >> 0x20),(Token)uVar3);
      local_31 = 1;
      if (!bVar1) {
        local_31 = try_word((SyntaxAnalyze *)CONCAT17(bVar4,in_stack_ffffffffffffffe0),
                            (int)(uVar3 >> 0x20),(Token)uVar3);
      }
    }
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool SyntaxAnalyze::try_word(int n, Token tk1, Token tk2, Token tk3) {
  bool return_value = false;
  if (matched_index + n < word_list.size()) {
    return_value = try_word(n, tk1) || try_word(n, tk2) || try_word(n, tk3);
  }
  return return_value;
}